

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ReadAnimationSampler(ColladaParser *this,AnimationChannel *pChannel)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *__s1;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *psVar4;
  allocator<char> local_69;
  string *local_68;
  string *local_60;
  string *local_58;
  string local_50;
  undefined4 extraout_var;
  
  local_68 = &pChannel->mInterpolationValues;
  local_60 = &pChannel->mOutTanValues;
  local_58 = &pChannel->mInTanValues;
LAB_003fa602:
  do {
    while( true ) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar2 == '\0') {
        return;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) break;
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"sampler");
        if (iVar2 == 0) {
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Expected end of <sampler> element.",&local_69);
        ThrowException(this,&local_50);
      }
    }
    bVar1 = IsElement(this,"input");
    if (bVar1) {
      uVar3 = GetAttribute(this,"semantic");
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
      __s1 = (char *)CONCAT44(extraout_var,iVar2);
      uVar3 = GetAttribute(this,"source");
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
      if (*(char *)CONCAT44(extraout_var_00,iVar2) != '#') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Unsupported URL format",&local_69);
        ThrowException(this,&local_50);
      }
      iVar2 = strcmp(__s1,"INPUT");
      psVar4 = &pChannel->mSourceTimes;
      if ((((iVar2 == 0) ||
           (iVar2 = strcmp(__s1,"OUTPUT"), psVar4 = &pChannel->mSourceValues, iVar2 == 0)) ||
          (iVar2 = strcmp(__s1,"IN_TANGENT"), psVar4 = local_58, iVar2 == 0)) ||
         ((iVar2 = strcmp(__s1,"OUT_TANGENT"), psVar4 = local_60, iVar2 == 0 ||
          (iVar2 = strcmp(__s1,"INTERPOLATION"), psVar4 = local_68, iVar2 == 0)))) {
        std::__cxx11::string::assign((char *)psVar4);
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
      if ((char)iVar2 != '\0') goto LAB_003fa602;
    }
    SkipElement(this);
  } while( true );
}

Assistant:

void ColladaParser::ReadAnimationSampler(Collada::AnimationChannel& pChannel)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                int indexSemantic = GetAttribute("semantic");
                const char* semantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* source = mReader->getAttributeValue(indexSource);
                if (source[0] != '#')
                    ThrowException("Unsupported URL format");
                source++;

                if (strcmp(semantic, "INPUT") == 0)
                    pChannel.mSourceTimes = source;
                else if (strcmp(semantic, "OUTPUT") == 0)
                    pChannel.mSourceValues = source;
                else if (strcmp(semantic, "IN_TANGENT") == 0)
                    pChannel.mInTanValues = source;
                else if (strcmp(semantic, "OUT_TANGENT") == 0)
                    pChannel.mOutTanValues = source;
                else if (strcmp(semantic, "INTERPOLATION") == 0)
                    pChannel.mInterpolationValues = source;

                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "sampler") != 0)
                ThrowException("Expected end of <sampler> element.");

            break;
        }
    }
}